

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall rtc::LogMessage::~LogMessage(LogMessage *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference ppVar4;
  pair<rtc::LogSink_*,_rtc::LoggingSeverity> *kv;
  iterator __end1;
  iterator __begin1;
  StreamList *__range1;
  CritScope cs;
  string *str;
  LogMessage *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)this," : ");
    std::operator<<(poVar3,(string *)&this->extra_);
  }
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  if (dbg_sev_ <= (int)this->severity_) {
    OutputToDebug((string *)&cs,this->severity_,&this->tag_);
  }
  CritScope::CritScope((CritScope *)&__range1,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  __end1 = std::__cxx11::
           list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
           ::begin((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
                    *)streams__abi_cxx11_);
  kv = (pair<rtc::LogSink_*,_rtc::LoggingSeverity> *)
       std::__cxx11::
       list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
       ::end((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
              *)streams__abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&kv);
    if (!bVar1) break;
    ppVar4 = std::_List_iterator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>::operator*
                       (&__end1);
    if ((int)ppVar4->second <= (int)this->severity_) {
      (**(code **)(*(long *)ppVar4->first + 0x10))(ppVar4->first,(string *)&cs);
    }
    std::_List_iterator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>::operator++(&__end1);
  }
  CritScope::~CritScope((CritScope *)&__range1);
  std::__cxx11::string::~string((string *)&cs);
  std::__cxx11::string::~string((string *)&this->extra_);
  std::__cxx11::string::~string((string *)&this->tag_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

LogMessage::~LogMessage() {
  if (!extra_.empty())
    print_stream_ << " : " << extra_;
  print_stream_ << std::endl;

  const std::string& str = print_stream_.str();
  if (severity_ >= dbg_sev_) {
    OutputToDebug(str, severity_, tag_);
  }

  CritScope cs(&g_log_crit);
  for (auto& kv : streams_) {
    if (severity_ >= kv.second) {
      kv.first->OnLogMessage(str);
    }
  }
}